

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O0

int mtar_find(mtar_t *tar,char *name,mtar_header_t *h)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_110 [8];
  mtar_header_t header;
  int err;
  mtar_header_t *h_local;
  char *name_local;
  mtar_t *tar_local;
  
  sVar2 = strlen(name);
  if (sVar2 < 100) {
    tar_local._4_4_ = mtar_rewind(tar);
    if (tar_local._4_4_ == 0) {
      header.linkname[0x60] = '\0';
      header.linkname[0x61] = '\0';
      header.linkname[0x62] = '\0';
      header.linkname[99] = '\0';
      while (header.linkname._96_4_ = mtar_read_header(tar,(mtar_header_t *)local_110),
            header.linkname._96_4_ == 0) {
        iVar1 = strcmp((char *)&header.mtime,name);
        if (iVar1 == 0) {
          if (h != (mtar_header_t *)0x0) {
            memcpy(h,local_110,0xe0);
          }
          return 0;
        }
        mtar_next(tar);
      }
      if (header.linkname._96_4_ == -7) {
        header.linkname[0x60] = -8;
        header.linkname[0x61] = -1;
        header.linkname[0x62] = -1;
        header.linkname[99] = -1;
      }
      tar_local._4_1_ = header.linkname[0x60];
      tar_local._5_1_ = header.linkname[0x61];
      tar_local._6_1_ = header.linkname[0x62];
      tar_local._7_1_ = header.linkname[99];
    }
  }
  else {
    tar_local._4_4_ = -9;
  }
  return tar_local._4_4_;
}

Assistant:

int mtar_find(mtar_t *tar, const char *name, mtar_header_t *h) {
  int err;
  mtar_header_t header;

  if (strlen(name) > MTAR_NAMEMAX)
    return MTAR_ENAMELONG;

  /* Start at beginning */
  err = mtar_rewind(tar);
  if (err) {
    return err;
  }
  /* Iterate all files until we hit an error or find the file */
  while ( (err = mtar_read_header(tar, &header)) == MTAR_ESUCCESS ) {
    if ( !strcmp(header.name, name) ) {
      if (h) {
        *h = header;
      }
      return MTAR_ESUCCESS;
    }
    mtar_next(tar);
  }
  /* Return error */
  if (err == MTAR_ENULLRECORD) {
    err = MTAR_ENOTFOUND;
  }
  return err;
}